

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
::
binary_search_impl<phmap::test_internal::MovableOnlyInstance,phmap::priv::upper_bound_adapter<std::less<phmap::test_internal::MovableOnlyInstance>>>
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
           *this,ulong *k,int s,int e)

{
  int iVar1;
  
  iVar1 = s;
  if (s != e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    do {
      test_internal::BaseCountedInstance::num_comparisons_ =
           test_internal::BaseCountedInstance::num_comparisons_ + 1;
      iVar1 = s + e >> 1;
      if (*(ulong *)(this + (long)iVar1 * 0x10 + 0x10) <= *k) {
        s = iVar1 + 1;
        iVar1 = e;
      }
      e = iVar1;
      iVar1 = e;
    } while (s != e);
  }
  return (SearchResult<int,_false>)iVar1;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }